

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O1

void __thiscall Diligent::ShaderResourceCacheVk::~ShaderResourceCacheVk(ShaderResourceCacheVk *this)

{
  void *ptr;
  DescriptorSet *pDVar1;
  Uint32 Index;
  long *plVar2;
  ulong uVar3;
  
  if ((this->m_pMemory)._M_t.
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl != (void *)0x0) {
    if ((*(uint *)&this->field_0x1c & 0x7fffffff) != 0) {
      plVar2 = (long *)((long)(this->m_pMemory)._M_t.
                              super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                              .super__Head_base<0UL,_void_*,_false>._M_head_impl +
                       (ulong)((uint)this->m_NumSets * 0x30) + 8);
      uVar3 = 0;
      do {
        if ((long *)*plVar2 != (long *)0x0) {
          (**(code **)(*(long *)*plVar2 + 0x10))();
          *plVar2 = 0;
        }
        uVar3 = uVar3 + 1;
        plVar2 = plVar2 + 4;
      } while (uVar3 < (*(uint *)&this->field_0x1c & 0x7fffffff));
    }
    if (this->m_NumSets != 0) {
      Index = 0;
      do {
        pDVar1 = GetDescriptorSet(this,Index);
        DescriptorSetAllocation::Release(&pDVar1->m_DescriptorSetAllocation);
        Index = Index + 1;
      } while (Index < this->m_NumSets);
    }
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&this->m_DbgInitializedResources);
  ptr = (this->m_pMemory)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pMemory,ptr);
  }
  (this->m_pMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  return;
}

Assistant:

ShaderResourceCacheVk::~ShaderResourceCacheVk()
{
    if (m_pMemory)
    {
        Resource* pResources = GetFirstResourcePtr();
        for (Uint32 res = 0; res < m_TotalResources; ++res)
            pResources[res].~Resource();
        for (Uint32 t = 0; t < m_NumSets; ++t)
            GetDescriptorSet(t).~DescriptorSet();
    }
}